

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O2

void __thiscall
libguarded::
rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
::rcu_guard::rcu_read_lock
          (rcu_guard *this,
          rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
          *list)

{
  bool bVar1;
  pointer pzVar2;
  zombie_list_node *oldNext;
  
  this->m_list = list;
  pzVar2 = std::
           allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::zombie_list_node>_>
           ::allocate((allocator_type *)(list + 0x41),1);
  this->m_zombie = pzVar2;
  (pzVar2->next)._M_b._M_p = (__pointer_type)0x0;
  (pzVar2->owner)._M_b._M_p = this;
  pzVar2->zombie_node = (node *)0x0;
  oldNext = *(zombie_list_node **)(list + 0x10);
  do {
    (this->m_zombie->next)._M_b._M_p = oldNext;
    bVar1 = std::
            atomic<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::zombie_list_node_*>
            ::compare_exchange_weak
                      ((atomic<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::zombie_list_node_*>
                        *)(list + 0x10),&oldNext,this->m_zombie,seq_cst);
  } while (!bVar1);
  return;
}

Assistant:

void rcu_list<T, M, Alloc>::rcu_guard::rcu_read_lock(const rcu_list<T, M, Alloc> &list)
{
   m_list   = &list;
   m_zombie = zombie_alloc_trait::allocate(list.m_zombie_alloc, 1);
   zombie_alloc_trait::construct(list.m_zombie_alloc, m_zombie, this);
   zombie_list_node *oldNext = list.m_zombie_head.load(std::memory_order_relaxed);

   do {
      m_zombie->next.store(oldNext, std::memory_order_relaxed);
   } while (!list.m_zombie_head.compare_exchange_weak(oldNext, m_zombie));
}